

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O2

void jinit_1pass_quantizer(j_decompress_ptr cinfo)

{
  uint uVar1;
  int iVar2;
  jpeg_error_mgr *pjVar3;
  bool bVar4;
  jpeg_color_quantizer *pjVar5;
  ulong uVar6;
  long lVar7;
  JSAMPARRAY ppJVar8;
  ulong uVar9;
  jpeg_error_mgr *pjVar10;
  int iVar11;
  ulong uVar12;
  JDIMENSION JVar13;
  uint uVar14;
  bool bVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  JDIMENSION local_44;
  
  pjVar5 = (jpeg_color_quantizer *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x98);
  cinfo->cquantize = pjVar5;
  pjVar5->start_pass = start_pass_1_quant;
  pjVar5->finish_pass = finish_pass_1_quant;
  pjVar5->new_color_map = new_color_map_1_quant;
  pjVar5[3].finish_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar5[2].finish_pass = (_func_void_j_decompress_ptr *)0x0;
  if (4 < cinfo->out_color_components) {
    *(undefined8 *)&cinfo->err->msg_code = 0x400000039;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar11 = cinfo->desired_number_of_colors;
  if (0x100 < iVar11) {
    *(undefined8 *)&cinfo->err->msg_code = 0x1000000003b;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    iVar11 = cinfo->desired_number_of_colors;
  }
  pjVar5 = cinfo->cquantize;
  uVar1 = cinfo->out_color_components;
  lVar18 = (long)iVar11;
  uVar9 = 1;
  do {
    uVar19 = uVar9;
    uVar9 = uVar19 + 1;
    uVar6 = uVar9;
    for (iVar11 = 1; iVar11 < (int)uVar1; iVar11 = iVar11 + 1) {
      uVar6 = uVar6 * uVar9;
    }
  } while ((long)uVar6 <= lVar18);
  if (uVar19 < 2) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x3a;
    (pjVar3->msg_parm).i[0] = (int)uVar6;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  uVar6 = 0;
  uVar9 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar9 = uVar6;
  }
  local_44 = 1;
  for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
    *(int *)((long)&pjVar5[1].new_color_map + uVar6 * 4 + 4) = (int)uVar19;
    local_44 = local_44 * (int)uVar19;
  }
  uVar6 = 0;
  bVar4 = true;
LAB_0023963b:
  do {
    bVar15 = bVar4;
    if (uVar6 != uVar9) {
      iVar11 = (int)uVar6;
      if (cinfo->out_color_space == JCS_RGB) {
        iVar11 = (&select_ncolors_RGB_order)[uVar6];
      }
      iVar2 = *(int *)((long)&pjVar5[1].new_color_map + (long)iVar11 * 4 + 4);
      lVar16 = (long)iVar2 + 1;
      lVar7 = ((int)local_44 / iVar2) * lVar16;
      if (lVar7 - lVar18 == 0 || lVar7 < lVar18) {
        *(int *)((long)&pjVar5[1].new_color_map + (long)iVar11 * 4 + 4) = (int)lVar16;
        uVar6 = uVar6 + 1;
        local_44 = (JDIMENSION)lVar7;
        bVar4 = false;
        goto LAB_0023963b;
      }
    }
    uVar6 = 0;
    bVar4 = true;
    if (bVar15) {
      iVar11 = cinfo->out_color_components;
      pjVar3 = cinfo->err;
      (pjVar3->msg_parm).i[0] = local_44;
      if (iVar11 == 3) {
        (pjVar3->msg_parm).i[1] = *(int *)((long)&pjVar5[1].new_color_map + 4);
        (pjVar3->msg_parm).i[2] = *(int *)&pjVar5[2].start_pass;
        (pjVar3->msg_parm).i[3] = *(int *)((long)&pjVar5[2].start_pass + 4);
        iVar11 = 0x60;
        pjVar10 = pjVar3;
      }
      else {
        pjVar10 = cinfo->err;
        iVar11 = 0x61;
      }
      pjVar3->msg_code = iVar11;
      (*pjVar10->emit_message)((j_common_ptr)cinfo,1);
      ppJVar8 = (*cinfo->mem->alloc_sarray)
                          ((j_common_ptr)cinfo,1,local_44,cinfo->out_color_components);
      JVar13 = local_44;
      for (lVar18 = 0; lVar18 < cinfo->out_color_components; lVar18 = lVar18 + 1) {
        uVar1 = *(uint *)((long)&pjVar5[1].new_color_map + lVar18 * 4 + 4);
        uVar14 = (int)JVar13 / (int)uVar1;
        uVar9 = (long)(int)uVar1 - 1;
        uVar6 = 0;
        uVar19 = 0;
        if (0 < (int)uVar14) {
          uVar19 = (ulong)uVar14;
        }
        uVar17 = 0;
        if (0 < (int)uVar1) {
          uVar17 = (ulong)uVar1;
        }
        iVar11 = 0;
        for (; uVar6 != uVar17; uVar6 = uVar6 + 1) {
          for (lVar7 = (long)iVar11; lVar7 < (int)local_44; lVar7 = lVar7 + (int)JVar13) {
            for (uVar12 = 0; uVar19 != uVar12; uVar12 = uVar12 + 1) {
              ppJVar8[lVar18][uVar12 + lVar7] =
                   (JSAMPLE)((long)(uVar6 * 0xff +
                                   (long)(int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 |
                                                     uVar9 & 0xffffffff) / 2)) / (long)uVar9);
            }
          }
          iVar11 = iVar11 + uVar14;
        }
        JVar13 = uVar14;
      }
      pjVar5[1].start_pass = (_func_void_j_decompress_ptr_boolean *)ppJVar8;
      *(JDIMENSION *)&pjVar5[1].color_quantize = local_44;
      create_colorindex(cinfo);
      if (cinfo->dither_mode == JDITHER_FS) {
        alloc_fs_workspace(cinfo);
        return;
      }
      return;
    }
  } while( true );
}

Assistant:

GLOBAL(void)
jinit_1pass_quantizer (j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize;

  cquantize = (my_cquantize_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_cquantizer));
  cinfo->cquantize = (struct jpeg_color_quantizer *) cquantize;
  cquantize->pub.start_pass = start_pass_1_quant;
  cquantize->pub.finish_pass = finish_pass_1_quant;
  cquantize->pub.new_color_map = new_color_map_1_quant;
  cquantize->fserrors[0] = NULL; /* Flag FS workspace not allocated */
  cquantize->odither[0] = NULL;	/* Also flag odither arrays not allocated */

  /* Make sure my internal arrays won't overflow */
  if (cinfo->out_color_components > MAX_Q_COMPS)
    ERREXIT1(cinfo, JERR_QUANT_COMPONENTS, MAX_Q_COMPS);
  /* Make sure colormap indexes can be represented by JSAMPLEs */
  if (cinfo->desired_number_of_colors > (MAXJSAMPLE+1))
    ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, MAXJSAMPLE+1);

  /* Create the colormap and color index table. */
  create_colormap(cinfo);
  create_colorindex(cinfo);

  /* Allocate Floyd-Steinberg workspace now if requested.
   * We do this now since it is FAR storage and may affect the memory
   * manager's space calculations.  If the user changes to FS dither
   * mode in a later pass, we will allocate the space then, and will
   * possibly overrun the max_memory_to_use setting.
   */
  if (cinfo->dither_mode == JDITHER_FS)
    alloc_fs_workspace(cinfo);
}